

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind.cc
# Opt level: O0

int absl::lts_20240722::str_format_internal::SnprintF
              (char *output,size_t size,UntypedFormatSpecImpl format,
              Span<const_absl::lts_20240722::str_format_internal::FormatArgImpl> args)

{
  bool bVar1;
  int *piVar2;
  unsigned_long *puVar3;
  size_t local_a8;
  unsigned_long local_98;
  size_t local_90;
  size_t total;
  size_type local_80;
  void *local_78;
  size_t local_70;
  FormatRawSinkImpl local_68;
  undefined1 local_58 [8];
  BufferRawSink sink;
  size_t size_local;
  char *output_local;
  Span<const_absl::lts_20240722::str_format_internal::FormatArgImpl> args_local;
  UntypedFormatSpecImpl format_local;
  
  if (size == 0) {
    local_a8 = 0;
  }
  else {
    local_a8 = size - 1;
  }
  sink.total_written_ = size;
  BufferRawSink::BufferRawSink((BufferRawSink *)local_58,output,local_a8);
  FormatRawSinkImpl::
  FormatRawSinkImpl<absl::lts_20240722::str_format_internal::BufferRawSink,_nullptr>
            (&local_68,(BufferRawSink *)local_58);
  total = (size_t)args.ptr_;
  local_80 = args.len_;
  local_78 = format.data_;
  local_70 = format.size_;
  bVar1 = FormatUntyped(local_68,format,args);
  if (bVar1) {
    local_90 = BufferRawSink::total_written((BufferRawSink *)local_58);
    if (sink.total_written_ != 0) {
      local_98 = sink.total_written_ - 1;
      puVar3 = std::min<unsigned_long>(&local_90,&local_98);
      output[*puVar3] = '\0';
    }
    format_local.size_._4_4_ = (int)local_90;
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    format_local.size_._4_4_ = -1;
  }
  return format_local.size_._4_4_;
}

Assistant:

int SnprintF(char* output, size_t size, const UntypedFormatSpecImpl format,
             absl::Span<const FormatArgImpl> args) {
  BufferRawSink sink(output, size ? size - 1 : 0);
  if (!FormatUntyped(&sink, format, args)) {
    errno = EINVAL;
    return -1;
  }
  size_t total = sink.total_written();
  if (size) output[std::min(total, size - 1)] = 0;
  return static_cast<int>(total);
}